

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O3

reference __thiscall
QVLABase<QString>::emplace_back_impl<QString>
          (QVLABase<QString> *this,qsizetype prealloc,void *array,QString *args)

{
  qsizetype *pqVar1;
  reference pvVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  qsizetype qVar5;
  long asize;
  long aalloc;
  
  asize = (this->super_QVLABaseBase).s;
  if (asize == (this->super_QVLABaseBase).a) {
    aalloc = asize + 1;
    if (asize + 1 < asize * 2) {
      aalloc = asize * 2;
    }
    reallocate_impl(this,prealloc,array,asize,aalloc);
    asize = (this->super_QVLABaseBase).s;
  }
  pvVar2 = (reference)((long)(this->super_QVLABaseBase).ptr + asize * 0x18);
  pDVar3 = (args->d).d;
  (args->d).d = (Data *)0x0;
  (pvVar2->d).d = pDVar3;
  pcVar4 = (args->d).ptr;
  (args->d).ptr = (char16_t *)0x0;
  (pvVar2->d).ptr = pcVar4;
  qVar5 = (args->d).size;
  (args->d).size = 0;
  (pvVar2->d).size = qVar5;
  pqVar1 = &(this->super_QVLABaseBase).s;
  *pqVar1 = *pqVar1 + 1;
  return pvVar2;
}

Assistant:

reference emplace_back_impl(qsizetype prealloc, void *array, Args&&...args)
    {
        if (size() == capacity()) // ie. size() != 0
            growBy(prealloc, array, 1);
        reference r = *q20::construct_at(end(), std::forward<Args>(args)...);
        ++s;
        return r;
    }